

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TgInitMan(Abc_TgMan_t *pMan,word *pTruth,int nVars,int nAlg,Vec_Int_t *vPhase)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  
  pMan->pTruth = pTruth;
  pMan->fPhased = 0;
  pMan->nGVars = nVars;
  pMan->nVars = nVars;
  pMan->nGroups = 1;
  pMan->uPhase = 0;
  pMan->pGroup[0].iStart = '\0';
  pMan->pGroup[0].nGVars = (char)nVars;
  uVar2 = 0;
  uVar3 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    cVar1 = (char)uVar2;
    pMan->pPerm[uVar2] = cVar1;
    pMan->pPermT[uVar2] = cVar1;
    pMan->pPermTRev[uVar2] = cVar1;
    pMan->symPhase[uVar2] = '\x01';
    pMan->symLink[uVar2] = -1;
  }
  pMan->symLink[uVar3] = -1;
  pMan->nAlgorithm = nAlg;
  pMan->vPhase = vPhase;
  vPhase->nSize = 0;
  return;
}

Assistant:

static void Abc_TgInitMan(Abc_TgMan_t * pMan, word * pTruth, int nVars, int nAlg, Vec_Int_t * vPhase)
{
    int i;
    pMan->pTruth = pTruth;
    pMan->uPhase = 0;
    pMan->fPhased = 0;
    pMan->nVars = pMan->nGVars = nVars;
    pMan->nGroups = 1;
    pMan->pGroup[0].iStart = 0;
    pMan->pGroup[0].nGVars = nVars;
    for (i = 0; i < nVars; i++)
    {
        pMan->pPerm[i] = i;
        pMan->pPermT[i] = i;
        pMan->pPermTRev[i] = i;
        pMan->symPhase[i] = 1;
        pMan->symLink[i] = -1;
    }
    pMan->symLink[i] = -1;
    pMan->nAlgorithm = nAlg;
    pMan->vPhase = vPhase;
    Vec_IntClear(vPhase);
}